

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O3

float plutovg_font_face_text_extents
                (plutovg_font_face_t *face,float size,void *text,int length,
                plutovg_text_encoding_t encoding,plutovg_rect_t *extents)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  ushort uVar4;
  float fVar5;
  plutovg_codepoint_t codepoint;
  glyph_t *pgVar6;
  plutovg_rect_t *ppVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  plutovg_rect_t glyph_extents;
  plutovg_text_iterator_t it;
  float local_5c;
  plutovg_rect_t local_58;
  plutovg_text_iterator_t local_48;
  
  plutovg_text_iterator_init(&local_48,text,length,encoding);
  if (local_48.index < local_48.length) {
    fVar9 = 0.0;
    ppVar7 = (plutovg_rect_t *)0x0;
    do {
      codepoint = plutovg_text_iterator_next(&local_48);
      if (extents == (plutovg_rect_t *)0x0) {
        uVar4 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
        pgVar6 = plutovg_font_face_get_glyph(face,codepoint);
        fVar5 = (float)pgVar6->advance_width * (size / (float)(ushort)(uVar4 << 8 | uVar4 >> 8));
      }
      else {
        plutovg_font_face_get_glyph_metrics(face,size,codepoint,&local_5c,(float *)0x0,&local_58);
        local_58.x = local_58.x + fVar9;
        fVar5 = local_5c;
        if (ppVar7 == (plutovg_rect_t *)0x0) {
          extents->x = local_58.x;
          extents->y = local_58.y;
          extents->w = local_58.w;
          extents->h = local_58.h;
          ppVar7 = extents;
        }
        else {
          uVar2._0_4_ = ppVar7->x;
          uVar2._4_4_ = ppVar7->y;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar2;
          uVar1 = ppVar7->w;
          uVar3 = ppVar7->h;
          auVar12._0_4_ = (float)uVar1 + (float)(undefined4)uVar2;
          auVar12._4_4_ = (float)uVar3 + (float)uVar2._4_4_;
          auVar12._8_8_ = 0;
          auVar11._4_4_ = local_58.y;
          auVar11._0_4_ = local_58.x;
          auVar11._8_8_ = 0;
          auVar11 = minps(auVar10,auVar11);
          auVar13._4_4_ = local_58.h + local_58.y;
          auVar13._0_4_ = local_58.w + local_58.x;
          auVar13._8_8_ = 0;
          auVar13 = maxps(auVar12,auVar13);
          ppVar7->x = (float)(int)auVar11._0_8_;
          ppVar7->y = (float)(int)(auVar11._0_8_ >> 0x20);
          ppVar7->w = auVar13._0_4_ - auVar11._0_4_;
          ppVar7->h = auVar13._4_4_ - auVar11._4_4_;
        }
      }
      fVar9 = fVar9 + fVar5;
    } while (local_48.index < local_48.length);
    bVar8 = ppVar7 != (plutovg_rect_t *)0x0;
  }
  else {
    fVar9 = 0.0;
    bVar8 = false;
  }
  if (extents != (plutovg_rect_t *)0x0 && !bVar8) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return fVar9;
}

Assistant:

float plutovg_font_face_text_extents(plutovg_font_face_t* face, float size, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text, length, encoding);
    plutovg_rect_t* text_extents = NULL;
    float total_advance_width = 0.f;
    while(plutovg_text_iterator_has_next(&it)) {
        plutovg_codepoint_t codepoint = plutovg_text_iterator_next(&it);

        float advance_width;
        if(extents == NULL) {
            plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, NULL);
            total_advance_width += advance_width;
            continue;
        }

        plutovg_rect_t glyph_extents;
        plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, &glyph_extents);

        glyph_extents.x += total_advance_width;
        total_advance_width += advance_width;
        if(text_extents == NULL) {
            text_extents = extents;
            *text_extents = glyph_extents;
            continue;
        }

        float x1 = plutovg_min(text_extents->x, glyph_extents.x);
        float y1 = plutovg_min(text_extents->y, glyph_extents.y);
        float x2 = plutovg_max(text_extents->x + text_extents->w, glyph_extents.x + glyph_extents.w);
        float y2 = plutovg_max(text_extents->y + text_extents->h, glyph_extents.y + glyph_extents.h);

        text_extents->x = x1;
        text_extents->y = y1;
        text_extents->w = x2 - x1;
        text_extents->h = y2 - y1;
    }

    if(extents && !text_extents) {
        extents->x = 0;
        extents->y = 0;
        extents->w = 0;
        extents->h = 0;
    }

    return total_advance_width;
}